

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<std::exception>>::
set_result<std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<std::exception>&>
          (async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<std::exception>_>
           *this,shared_ptr<cornerstone::resp_msg> *result,shared_ptr<std::exception> *err)

{
  bool bVar1;
  mutex_type *in_RDI;
  lock_guard<std::mutex> guard;
  handler_type handler;
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
  *in_stack_ffffffffffffffb0;
  shared_ptr<cornerstone::resp_msg> *in_stack_ffffffffffffffb8;
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
  *in_stack_ffffffffffffffc0;
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
  *in_stack_ffffffffffffffc8;
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
  *in_stack_ffffffffffffffd0;
  
  std::
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
  ::function(in_stack_ffffffffffffffb0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,in_RDI);
  std::shared_ptr<cornerstone::resp_msg>::operator=
            ((shared_ptr<cornerstone::resp_msg> *)in_stack_ffffffffffffffb0,
             (shared_ptr<cornerstone::resp_msg> *)in_RDI);
  std::shared_ptr<std::exception>::operator=
            ((shared_ptr<std::exception> *)in_stack_ffffffffffffffb0,
             (shared_ptr<std::exception> *)in_RDI);
  (in_RDI->super___mutex_base)._M_mutex.__size[0x20] = '\x01';
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
                      *)0x13674b);
  if (bVar1) {
    std::
    function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
    ::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13679b);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
                      *)0x1367a5);
  if (bVar1) {
    std::
    function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
    ::operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (shared_ptr<std::exception> *)in_stack_ffffffffffffffb0);
  }
  std::condition_variable::notify_all();
  std::
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
  ::~function((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
               *)0x1367db);
  return;
}

Assistant:

void set_result(_TResult&& result, _TException&& err)
    {
        handler_type handler;
        {
            std::lock_guard<std::mutex> guard(lock_);
            result_ = std::forward<_TResult>(result);
            err_ = std::forward<_TException>(err);
            has_result_ = true;
            if (handler_)
            {
                handler = handler_; // copy handler as std::function assignment is not atomic guaranteed
            }
        }

        if (handler)
        {
            handler(result_, err_);
        }

        cv_.notify_all();
    }